

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O1

double Open_JTalk_get_alpha(Open_JTalk *open_jtalk,_Bool *error)

{
  double dVar1;
  
  if (error != (_Bool *)0x0) {
    *error = false;
  }
  if (open_jtalk != (Open_JTalk *)0x0) {
    dVar1 = HTS_Engine_get_alpha(&open_jtalk->engine);
    return dVar1;
  }
  if (error != (_Bool *)0x0) {
    *error = true;
  }
  return 0.0;
}

Assistant:

double Open_JTalk_get_alpha(Open_JTalk *open_jtalk, bool *error)
{
	if (error)
	{
		*error = false;
	}

	if (open_jtalk == NULL)
	{
		if (error)
		{
			*error = true;
		}
		return 0;
	}
	return HTS_Engine_get_alpha(&open_jtalk->engine);
}